

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void doctest::detail::
     filldata<boost::iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>_>_>
     ::fill(ostream *stream,
           iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>_>
           *in)

{
  __copy_move<false,false,std::input_iterator_tag> local_a0 [16];
  ostream_iterator<int,_char,_std::char_traits<char>_> local_90;
  take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>
  local_80;
  take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>
  local_58;
  
  local_58.m_begin._M_stream =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_Begin.m_begin._M_stream;
  local_58.m_begin._M_value =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_Begin.m_begin._M_value;
  local_58.m_begin._M_ok =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_Begin.m_begin._M_ok;
  local_58.m_end._M_stream =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_Begin.m_end._M_stream;
  local_58.m_end._M_value =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_Begin.m_end._M_value;
  local_58.m_end._M_ok =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_Begin.m_end._M_ok;
  local_58.m_remaining =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_Begin.m_remaining;
  local_80.m_begin._M_stream =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_End.m_begin._M_stream;
  local_80.m_begin._M_value =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_End.m_begin._M_value;
  local_80.m_begin._M_ok =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_End.m_begin._M_ok;
  local_80.m_end._M_stream =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_End.m_end._M_stream;
  local_80.m_end._M_value =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_End.m_end._M_value;
  local_80.m_end._M_ok =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_End.m_end._M_ok;
  local_80.m_remaining =
       (in->
       super_iterator_range_base<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_End.m_remaining;
  local_90._M_string = (char *)0x0;
  local_90._M_stream = stream;
  std::__copy_move<false,false,std::input_iterator_tag>::
  __copy_m<burst::take_at_most_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,long>,std::ostream_iterator<int,char,std::char_traits<char>>>
            (local_a0,&local_58,&local_80,&local_90);
  return;
}

Assistant:

static void fill(std::ostream* stream, const T& in) {
#if defined(_MSC_VER) && _MSC_VER <= 1900
        insert_hack_t<T>::insert(*stream, in);
#else
        operator<<(*stream, in);
#endif
        }